

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

FunctionBody * __thiscall
Js::DeferDeserializeFunctionInfo::Deserialize(DeferDeserializeFunctionInfo *this)

{
  code *pcVar1;
  bool bVar2;
  LocalFunctionId functionId;
  undefined4 *puVar3;
  FunctionBody *body;
  JavascriptMethod originalEntryPoint;
  FunctionBody *pFVar4;
  
  if ((DeferDeserializeFunctionInfo *)
      (((this->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x8b0,"(this->GetFunctionInfo()->GetFunctionProxy() == this)",
                                "this->GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) goto LAB_006c94f6;
    *puVar3 = 0;
  }
  body = ByteCodeSerializer::DeserializeFunction((this->super_FunctionProxy).m_scriptContext,this);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)body);
  FunctionProxy::SetLocalFunctionId(&this->super_FunctionProxy,functionId);
  originalEntryPoint = FunctionProxy::GetOriginalEntryPoint((FunctionProxy *)body);
  FunctionProxy::SetOriginalEntryPoint(&this->super_FunctionProxy,originalEntryPoint);
  FunctionProxy::Copy(&this->super_FunctionProxy,(FunctionProxy *)body);
  FunctionProxy::UpdateFunctionBodyImpl(&this->super_FunctionProxy,body);
  pFVar4 = FunctionProxy::GetFunctionBody((FunctionProxy *)body);
  if (pFVar4 != body) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x8b8,"(body->GetFunctionBody() == body)",
                                "body->GetFunctionBody() == body");
    if (!bVar2) {
LAB_006c94f6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return body;
}

Assistant:

FunctionBody* DeferDeserializeFunctionInfo::Deserialize()
    {
        Assert(this->GetFunctionInfo()->GetFunctionProxy() == this);

        FunctionBody * body = ByteCodeSerializer::DeserializeFunction(this->m_scriptContext, this);
        this->SetLocalFunctionId(body->GetLocalFunctionId());
        this->SetOriginalEntryPoint(body->GetOriginalEntryPoint());
        this->Copy(body);
        this->UpdateFunctionBodyImpl(body);

        Assert(body->GetFunctionBody() == body);
        return body;
    }